

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall dynet::AdagradTrainer::update_params(AdagradTrainer *this,real gscale,size_t idx)

{
  ParameterStorage *pPVar1;
  ParameterCollectionStorage *pPVar2;
  initializer_list<dynet::Tensor_*> __l;
  allocator_type local_45;
  real local_44;
  _Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> local_40;
  Tensor *local_28;
  Tensor *local_20;
  pointer local_18;
  
  local_44 = gscale;
  pPVar2 = ParameterCollection::get_storage((this->super_Trainer).model);
  pPVar1 = (pPVar2->params).
           super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
           ._M_impl.super__Vector_impl_data._M_start[idx];
  local_28 = &pPVar1->values;
  local_20 = &pPVar1->g;
  local_18 = (this->vp).
             super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_start + idx;
  __l._M_len = 3;
  __l._M_array = &local_28;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector
            ((vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)&local_40,__l,&local_45);
  (*(this->super_Trainer)._vptr_Trainer[5])(local_44,this,&local_40);
  std::_Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void AdagradTrainer::update_params(real gscale, size_t idx) {
  auto & p = model->parameters_list()[idx];
  update_rule(gscale, {&p->values, &p->g, &vp[idx].h});
}